

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_address.cpp
# Opt level: O3

Address * __thiscall
cfd::AddressFactory::CreateAddress
          (Address *__return_storage_ptr__,AddressFactory *this,AddressType address_type,
          Pubkey *pubkey,Script *script,Script *locking_script,Script *redeem_script)

{
  bool bVar1;
  CfdException *pCVar2;
  Script temp_script;
  AddressType local_1fc;
  undefined1 local_1f8 [32];
  char local_1d8 [16];
  pointer local_1c8;
  pointer local_1b0;
  pointer local_198;
  TapBranch local_180;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_108;
  Script local_f0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_b0;
  SchnorrPubkey local_80;
  Script local_68;
  
  local_1fc = address_type;
  if ((((pubkey == (Pubkey *)0x0) || (bVar1 = core::Pubkey::IsValid(pubkey), !bVar1)) &&
      (address_type < kWitnessUnknown)) && ((0xd4U >> (address_type & 0x1f) & 1) != 0)) {
    local_1f8._0_8_ = "cfd_address.cpp";
    local_1f8._8_4_ = 0xe4;
    local_1f8._16_8_ = (long)"CfdCreateAddress" + 3;
    core::logger::log<>((CfdSourceLocation *)local_1f8,kCfdLogLevelWarning,
                        "Failed to CreateAddress. Invalid pubkey hex: pubkey is empty.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    local_1f8._0_8_ = local_1f8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"pubkey hex is empty.","");
    core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_1f8);
    __cxa_throw(pCVar2,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  if (((script == (Script *)0x0) || (bVar1 = core::Script::IsEmpty(script), bVar1)) &&
     ((address_type < kP2shP2wpkhAddress && ((0x2aU >> (address_type & 0x1f) & 1) != 0)))) {
    local_1f8._0_8_ = "cfd_address.cpp";
    local_1f8._8_4_ = 0xef;
    local_1f8._16_8_ = (long)"CfdCreateAddress" + 3;
    core::logger::log<>((CfdSourceLocation *)local_1f8,kCfdLogLevelWarning,
                        "Failed to CreateAddress. Invalid script hex: script is empty.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    local_1f8._0_8_ = local_1f8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"script hex is empty.","");
    core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_1f8);
    __cxa_throw(pCVar2,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  core::Address::Address(__return_storage_ptr__);
  core::Script::Script(&local_68);
  switch(address_type) {
  case kP2shAddress:
    core::Address::Address((Address *)local_1f8,this->type_,script,&this->prefix_list_);
    core::Address::operator=(__return_storage_ptr__,(Address *)local_1f8);
    break;
  case kP2pkhAddress:
    core::Address::Address((Address *)local_1f8,this->type_,pubkey,&this->prefix_list_);
    core::Address::operator=(__return_storage_ptr__,(Address *)local_1f8);
    break;
  case kP2wshAddress:
    core::Address::Address((Address *)local_1f8,this->type_,kVersion0,script,&this->prefix_list_);
    core::Address::operator=(__return_storage_ptr__,(Address *)local_1f8);
    break;
  case kP2wpkhAddress:
    core::Address::Address((Address *)local_1f8,this->type_,kVersion0,pubkey,&this->prefix_list_);
    core::Address::operator=(__return_storage_ptr__,(Address *)local_1f8);
    break;
  case kP2shP2wshAddress:
    core::ScriptUtil::CreateP2wshLockingScript((Script *)local_1f8,script);
    core::Script::operator=(&local_68,(Script *)local_1f8);
    core::Script::~Script((Script *)local_1f8);
    core::Address::Address((Address *)local_1f8,this->type_,&local_68,&this->prefix_list_);
    core::Address::operator=(__return_storage_ptr__,(Address *)local_1f8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_b0);
    core::Script::~Script(&local_f0);
    local_180._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_0072eb30;
    std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
              (&local_108);
    core::TapBranch::~TapBranch(&local_180);
    if (local_198 != (pointer)0x0) {
      operator_delete(local_198);
    }
    if (local_1b0 != (pointer)0x0) {
      operator_delete(local_1b0);
    }
    if (local_1c8 != (pointer)0x0) {
      operator_delete(local_1c8);
    }
    if ((char *)local_1f8._16_8_ != local_1d8) {
      operator_delete((void *)local_1f8._16_8_);
    }
    goto joined_r0x003a9544;
  case kP2shP2wpkhAddress:
    core::ScriptUtil::CreateP2wpkhLockingScript((Script *)local_1f8,pubkey);
    core::Script::operator=(&local_68,(Script *)local_1f8);
    core::Script::~Script((Script *)local_1f8);
    core::Address::Address((Address *)local_1f8,this->type_,&local_68,&this->prefix_list_);
    core::Address::operator=(__return_storage_ptr__,(Address *)local_1f8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_b0);
    core::Script::~Script(&local_f0);
    local_180._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_0072eb30;
    std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
              (&local_108);
    core::TapBranch::~TapBranch(&local_180);
    if (local_198 != (pointer)0x0) {
      operator_delete(local_198);
    }
    if (local_1b0 != (pointer)0x0) {
      operator_delete(local_1b0);
    }
    if (local_1c8 != (pointer)0x0) {
      operator_delete(local_1c8);
    }
    if ((char *)local_1f8._16_8_ != local_1d8) {
      operator_delete((void *)local_1f8._16_8_);
    }
joined_r0x003a9544:
    if (redeem_script != (Script *)0x0) {
      core::Script::operator=(redeem_script,&local_68);
    }
    goto LAB_003a9633;
  case kTaprootAddress:
    core::SchnorrPubkey::FromPubkey(&local_80,pubkey,(bool *)0x0);
    core::Address::Address((Address *)local_1f8,this->type_,kVersion1,&local_80,&this->prefix_list_)
    ;
    core::Address::operator=(__return_storage_ptr__,(Address *)local_1f8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_b0);
    core::Script::~Script(&local_f0);
    local_180._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_0072eb30;
    std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
              (&local_108);
    core::TapBranch::~TapBranch(&local_180);
    if (local_198 != (pointer)0x0) {
      operator_delete(local_198);
    }
    if (local_1b0 != (pointer)0x0) {
      operator_delete(local_1b0);
    }
    if (local_1c8 != (pointer)0x0) {
      operator_delete(local_1c8);
    }
    if ((char *)local_1f8._16_8_ != local_1d8) {
      operator_delete((void *)local_1f8._16_8_);
    }
    if (local_80.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start == (pointer)0x0) goto LAB_003a9633;
    goto LAB_003a9459;
  default:
    local_1f8._0_8_ = "cfd_address.cpp";
    local_1f8._8_4_ = 0x118;
    local_1f8._16_8_ = (long)"CfdCreateAddress" + 3;
    core::logger::log<cfd::core::AddressType&>
              ((CfdSourceLocation *)local_1f8,kCfdLogLevelWarning,
               "Failed to CreateAddress. Invalid address type:  address_type={}",&local_1fc);
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    local_1f8._0_8_ = local_1f8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1f8,
               "Invalid address_type. address_type must be \"p2pkh\" or \"p2sh\" or \"p2wpkh\" or \"p2wsh\" or \"p2sh-p2wpkh\" or \"p2sh-p2wsh\"."
               ,"");
    core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_1f8);
    __cxa_throw(pCVar2,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_b0);
  core::Script::~Script(&local_f0);
  local_180._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_0072eb30;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_108);
  core::TapBranch::~TapBranch(&local_180);
  if (local_198 != (pointer)0x0) {
    operator_delete(local_198);
  }
  if (local_1b0 != (pointer)0x0) {
    operator_delete(local_1b0);
  }
  if (local_1c8 != (pointer)0x0) {
    operator_delete(local_1c8);
  }
  local_80.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_1f8._16_8_;
  if ((char *)local_1f8._16_8_ != local_1d8) {
LAB_003a9459:
    operator_delete(local_80.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
LAB_003a9633:
  if (locking_script != (Script *)0x0) {
    core::Address::GetLockingScript((Script *)local_1f8,__return_storage_ptr__);
    core::Script::operator=(locking_script,(Script *)local_1f8);
    core::Script::~Script((Script *)local_1f8);
  }
  core::Script::~Script(&local_68);
  return __return_storage_ptr__;
}

Assistant:

Address AddressFactory::CreateAddress(
    AddressType address_type, const Pubkey* pubkey, const Script* script,
    Script* locking_script, Script* redeem_script) const {
  if ((pubkey == nullptr) || (!pubkey->IsValid())) {
    if (address_type == AddressType::kP2pkhAddress ||
        address_type == AddressType::kP2wpkhAddress ||
        address_type == AddressType::kP2shP2wpkhAddress ||
        address_type == AddressType::kTaprootAddress) {
      warn(
          CFD_LOG_SOURCE,
          "Failed to CreateAddress. Invalid pubkey hex: pubkey is empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "pubkey hex is empty.");
    }
  }
  if ((script == nullptr) || (script->IsEmpty())) {
    if (address_type == AddressType::kP2shAddress ||
        address_type == AddressType::kP2wshAddress ||
        address_type == AddressType::kP2shP2wshAddress) {
      warn(
          CFD_LOG_SOURCE,
          "Failed to CreateAddress. Invalid script hex: script is empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "script hex is empty.");
    }
  }
  Address addr;

  Script temp_script;
  switch (address_type) {
    case AddressType::kP2pkhAddress:
      addr = CreateP2pkhAddress(*pubkey);
      break;
    case AddressType::kP2shAddress:
      addr = CreateP2shAddress(*script);
      break;
    case AddressType::kP2wpkhAddress:
      addr = CreateP2wpkhAddress(*pubkey);
      break;
    case AddressType::kP2wshAddress:
      addr = CreateP2wshAddress(*script);
      break;
    case AddressType::kP2shP2wpkhAddress:
      temp_script = ScriptUtil::CreateP2wpkhLockingScript(*pubkey);
      addr = CreateP2shAddress(temp_script);
      if (redeem_script != nullptr) {
        *redeem_script = temp_script;
      }
      break;
    case AddressType::kP2shP2wshAddress:
      temp_script = ScriptUtil::CreateP2wshLockingScript(*script);
      addr = CreateP2shAddress(temp_script);
      if (redeem_script != nullptr) {
        *redeem_script = temp_script;
      }
      break;
    case AddressType::kTaprootAddress:
      addr = CreateTaprootAddress(SchnorrPubkey::FromPubkey(*pubkey));
      break;
    default:
      warn(
          CFD_LOG_SOURCE,
          "Failed to CreateAddress. Invalid address type:  address_type={}",
          address_type);
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Invalid address_type. address_type must be \"p2pkh\" or "
          "\"p2sh\" or \"p2wpkh\" or \"p2wsh\" or \"p2sh-p2wpkh\" or "
          "\"p2sh-p2wsh\".");  // NOLINT
      break;
  }
  if (locking_script != nullptr) {
    *locking_script = addr.GetLockingScript();
  }

  return addr;
}